

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

session_params * __thiscall
libtorrent::aux::session_impl::session_state
          (session_params *__return_storage_ptr__,session_impl *this,save_state_flags_t flags)

{
  bool bVar1;
  element_type *this_00;
  const_reference this_01;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  mapped_type *this_02;
  element_type *peVar4;
  bool local_1f1;
  bool local_1d9;
  uint local_1b4;
  reference local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *v;
  iterator __end4;
  iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  state;
  shared_ptr<libtorrent::plugin> *ext;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  uint local_134;
  dht_state local_130;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  dht_settings local_d8;
  uint local_98;
  uint local_94;
  uint local_90 [4];
  settings_pack local_80;
  uint local_30;
  uint local_2c;
  uint local_28;
  undefined1 local_21;
  session_impl *local_20;
  session_impl *this_local;
  session_params *psStack_10;
  save_state_flags_t flags_local;
  session_params *ret;
  
  local_21 = 0;
  local_20 = this;
  this_local._4_4_ = flags.m_val;
  psStack_10 = __return_storage_ptr__;
  session_params::session_params(__return_storage_ptr__);
  local_2c = this_local._4_4_;
  local_30 = 1;
  local_28 = (uint)libtorrent::flags::operator&
                             (this_local._4_4_,
                              (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>)1
                             );
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_28);
  if (bVar1) {
    non_default_settings(&local_80,&this->m_settings);
    settings_pack::operator=
              (&__return_storage_ptr__->settings,
               (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *)
               &local_80);
    settings_pack::~settings_pack(&local_80);
  }
  local_94 = this_local._4_4_;
  local_98 = 2;
  local_90[0] = (uint)libtorrent::flags::operator&
                                (this_local._4_4_,
                                 (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                  )2);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_90);
  if (bVar1) {
    get_dht_settings(&local_d8,this);
    memcpy(&__return_storage_ptr__->dht_settings,&local_d8,0x40);
  }
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_dht);
  local_1d9 = false;
  if (bVar1) {
    local_e0 = this_local._4_4_;
    local_e4 = 4;
    local_dc = (uint)libtorrent::flags::operator&
                               (this_local._4_4_,
                                (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                )4);
    local_1d9 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_dc);
  }
  if (local_1d9 != false) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_dht);
    libtorrent::dht::dht_tracker::state(&local_130,this_00);
    libtorrent::dht::dht_state::operator=(&__return_storage_ptr__->dht_state,&local_130);
    libtorrent::dht::dht_state::~dht_state(&local_130);
  }
  local_134 = (uint)libtorrent::flags::operator&
                              (this_local._4_4_,
                               (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>)
                               0x800);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_134);
  if (bVar1) {
    this_01 = ::std::
              array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
              ::operator[](&this->m_ses_extensions,0);
    __end3 = ::std::
             vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             ::begin(this_01);
    ext = (shared_ptr<libtorrent::plugin> *)
          ::std::
          vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
          ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                                       *)&ext), bVar1) {
      state._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)__gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                   ::operator*(&__end3);
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)state._M_t._M_impl.super__Rb_tree_header._M_node_count);
      (*peVar2->_vptr_plugin[0xd])(&__range4);
      __end4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range4);
      v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range4);
      while (bVar1 = ::std::operator!=(&__end4,(_Self *)&v), bVar1) {
        local_1b0 = ::std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator*(&__end4);
        pbVar3 = &local_1b0->second;
        this_02 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&__return_storage_ptr__->ext_state,&local_1b0->first);
        ::std::__cxx11::string::operator=((string *)this_02,(string *)pbVar3);
        ::std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end4);
      }
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range4);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
      ::operator++(&__end3);
    }
  }
  local_1b4 = (uint)libtorrent::flags::operator&
                              (this_local._4_4_,
                               (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>)
                               0x1000);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_1b4);
  local_1f1 = false;
  if (bVar1) {
    local_1f1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ip_filter);
  }
  if (local_1f1 != false) {
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_ip_filter);
    ip_filter::operator=(&__return_storage_ptr__->ip_filter,peVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

session_params session_impl::session_state(save_state_flags_t const flags) const
	{
		TORRENT_ASSERT(is_single_thread());

		session_params ret;
		if (flags & session::save_settings)
			ret.settings = non_default_settings(m_settings);

#ifndef TORRENT_DISABLE_DHT
#if TORRENT_ABI_VERSION <= 2
	if (flags & session_handle::save_dht_settings)
	{
		ret.dht_settings = get_dht_settings();
	}
#endif

		if (m_dht && (flags & session::save_dht_state))
			ret.dht_state = m_dht->state();
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		if (flags & session::save_extension_state)
		{
			for (auto const& ext : m_ses_extensions[plugins_all_idx])
			{
				auto state = ext->save_state();
				for (auto& v : state)
					ret.ext_state[std::move(v.first)] = std::move(v.second);
			}
		}
#endif

		if ((flags & session::save_ip_filter) && m_ip_filter)
		{
			ret.ip_filter = *m_ip_filter;
		}
		return ret;
	}